

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O2

int64_t absl::base_internal::ReadMonotonicClockNanos(void)

{
  int iVar1;
  int *piVar2;
  timespec t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string local_28;
  
  iVar1 = clock_gettime(4,(timespec *)&t);
  if (iVar1 == 0) {
    return t.tv_sec * 1000000000 + t.tv_nsec;
  }
  piVar2 = __errno_location();
  std::__cxx11::to_string(&local_28,*piVar2);
  std::operator+(&local_68,"clock_gettime() failed: (",&local_28);
  std::operator+(&local_48,&local_68,")");
  (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
            (3,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O2/_deps/abseil-cpp-src/absl/base/internal/sysinfo.cc"
             ,0xf8,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_28);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O2/_deps/abseil-cpp-src/absl/base/internal/sysinfo.cc"
                ,0xf8,"int64_t absl::base_internal::ReadMonotonicClockNanos()");
}

Assistant:

static int64_t ReadMonotonicClockNanos() {
  struct timespec t;
#ifdef CLOCK_MONOTONIC_RAW
  int rc = clock_gettime(CLOCK_MONOTONIC_RAW, &t);
#else
  int rc = clock_gettime(CLOCK_MONOTONIC, &t);
#endif
  if (rc != 0) {
    ABSL_INTERNAL_LOG(
        FATAL, "clock_gettime() failed: (" + std::to_string(errno) + ")");
  }
  return int64_t{t.tv_sec} * 1000000000 + t.tv_nsec;
}